

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 12_string_object.cpp
# Opt level: O0

void display_all_strings(string *list,int n)

{
  ostream *poVar1;
  int local_18;
  int i;
  int n_local;
  string *list_local;
  
  for (local_18 = 0; local_18 < n; local_18 = local_18 + 1) {
    poVar1 = (ostream *)std::ostream::operator<<(&std::cout,local_18 + 1);
    poVar1 = std::operator<<(poVar1," : ");
    poVar1 = std::operator<<(poVar1,(string *)(list + local_18));
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void display_all_strings(const std::string list[], int n) {
    for(int i = 0; i < n; i++) {
        std::cout << i + 1 << " : " << list[i] << std::endl;
    }
}